

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O0

void __thiscall
soplex::DataArray<soplex::SPxBasisBase<double>::Desc::Status>::DataArray
          (DataArray<soplex::SPxBasisBase<double>::Desc::Status> *this,int p_size,int p_max,
          Real p_fac)

{
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  undefined8 in_XMM0_Qa;
  int local_28;
  int local_24;
  
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *(undefined8 *)(in_RDI + 4) = in_XMM0_Qa;
  local_24 = in_ESI;
  if (in_ESI < 0) {
    local_24 = 0;
  }
  *in_RDI = local_24;
  if (*in_RDI < in_EDX) {
    in_RDI[1] = in_EDX;
  }
  else {
    if (*in_RDI == 0) {
      local_28 = 1;
    }
    else {
      local_28 = *in_RDI;
    }
    in_RDI[1] = local_28;
  }
  spx_alloc<soplex::SPxBasisBase<double>::Desc::Status*>((Status **)this,p_size);
  return;
}

Assistant:

explicit DataArray(int p_size = 0, int p_max = 0, Real p_fac = 1.2)
      : data(nullptr)
      , memFactor(p_fac)
   {
      thesize = (p_size < 0) ? 0 : p_size;

      if(p_max > thesize)
         themax = p_max;
      else
         themax = (thesize == 0) ? 1 : thesize;

      spx_alloc(data, themax);

      assert(isConsistent());
   }